

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O2

void ipc_pipe_stop(void *arg)

{
  nni_mtx *mtx;
  
  mtx = *(nni_mtx **)((long)arg + 0x20);
  nni_aio_stop((nni_aio *)((long)arg + 0x270));
  nni_aio_stop((nni_aio *)((long)arg + 0xa8));
  nni_aio_stop((nni_aio *)((long)arg + 0x438));
  nng_stream_stop(*arg);
  nni_mtx_lock(mtx);
  nni_list_node_remove((nni_list_node *)((long)arg + 0x30));
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
ipc_pipe_stop(void *arg)
{
	ipc_pipe *p  = arg;
	ipc_ep   *ep = p->ep;

	nni_aio_stop(&p->rx_aio);
	nni_aio_stop(&p->tx_aio);
	nni_aio_stop(&p->neg_aio);
	nng_stream_stop(p->conn);
	nni_mtx_lock(&ep->mtx);
	nni_list_node_remove(&p->node);
	nni_mtx_unlock(&ep->mtx);
}